

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.c
# Opt level: O2

PerspectiveCamera *
create_perspective_camera
          (PerspectiveCamera *__return_storage_ptr__,Vec3 pos,Vec3 target,float ratio,float fov)

{
  float fVar1;
  Vec3 VVar2;
  Vec3 VVar3;
  
  (__return_storage_ptr__->eye).x = (float)(int)pos._0_8_;
  (__return_storage_ptr__->eye).y = (float)(int)((ulong)pos._0_8_ >> 0x20);
  (__return_storage_ptr__->eye).z = pos.z;
  __return_storage_ptr__->depth = 1.0;
  VVar2.x = pos.x - target.x;
  VVar2.y = pos.y - target.y;
  VVar2.z = pos.z - target.z;
  VVar2 = normalized(VVar2);
  __return_storage_ptr__->basis[2].x = (float)(int)VVar2._0_8_;
  __return_storage_ptr__->basis[2].y = (float)(int)((ulong)VVar2._0_8_ >> 0x20);
  __return_storage_ptr__->basis[2].z = VVar2.z;
  VVar3.z = 1.0;
  VVar3.x = 0.00123;
  VVar3.y = -0.000987;
  VVar3 = cross(VVar3,VVar2);
  VVar3 = normalized(VVar3);
  __return_storage_ptr__->basis[0].x = (float)(int)VVar3._0_8_;
  __return_storage_ptr__->basis[0].y = (float)(int)((ulong)VVar3._0_8_ >> 0x20);
  __return_storage_ptr__->basis[0].z = VVar3.z;
  VVar2 = cross(VVar2,VVar3);
  __return_storage_ptr__->basis[1].x = (float)(int)VVar2._0_8_;
  __return_storage_ptr__->basis[1].y = (float)(int)((ulong)VVar2._0_8_ >> 0x20);
  __return_storage_ptr__->basis[1].z = VVar2.z;
  fVar1 = atanf((fov * 3.1415927) / 360.0);
  __return_storage_ptr__->xscale = fVar1;
  __return_storage_ptr__->yscale = fVar1 / ratio;
  return __return_storage_ptr__;
}

Assistant:

PerspectiveCamera create_perspective_camera(Vec3 pos, Vec3 target, float ratio, float fov) {
    PerspectiveCamera cam;
    cam.eye = pos;
    cam.depth = 1.0f;

    cam.basis[2] = normalized(vsub(pos, target));
    cam.basis[0] = normalized(
        cross((Vec3) {0.00123f, -0.000987f, 1.0f}, cam.basis[2])
        );
    cam.basis[1] = cross(cam.basis[2], cam.basis[0]);

    cam.xscale = atanf(fov * PI / 360.0f);
    cam.yscale = cam.xscale / ratio;

    return cam;
}